

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O0

void test35(char *infile,char *password,char *outfile,char *xarg)

{
  qpdf_data p_Var1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  qpdf_oh range;
  qpdf_error e;
  char *xarg_local;
  char *outfile_local;
  char *password_local;
  char *infile_local;
  
  iVar2 = qpdf_get_num_pages(qpdf);
  if (iVar2 != -1) {
    __assert_fail("qpdf_get_num_pages(qpdf) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x421,"void test35(const char *, const char *, const char *, const char *)");
  }
  iVar2 = qpdf_has_error(qpdf);
  if (iVar2 == 0) {
    __assert_fail("qpdf_has_error(qpdf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x422,"void test35(const char *, const char *, const char *, const char *)");
  }
  uVar4 = qpdf_get_error(qpdf);
  iVar2 = qpdf_get_error_code(qpdf,uVar4);
  if (iVar2 == 0) {
    __assert_fail("qpdf_get_error_code(qpdf, e) != QPDF_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x424,"void test35(const char *, const char *, const char *, const char *)");
  }
  iVar2 = qpdf_has_error(qpdf);
  if (iVar2 != 0) {
    __assert_fail("!qpdf_has_error(qpdf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x425,"void test35(const char *, const char *, const char *, const char *)");
  }
  iVar2 = qpdf_read(qpdf,infile,password);
  if (iVar2 != 0) {
    __assert_fail("qpdf_read(qpdf, infile, password) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x427,"void test35(const char *, const char *, const char *, const char *)");
  }
  uVar3 = qpdf_get_page_n(qpdf,0xb);
  iVar2 = qpdf_oh_is_initialized(qpdf,uVar3);
  if (iVar2 != 0) {
    __assert_fail("!qpdf_oh_is_initialized(qpdf, range)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x42a,"void test35(const char *, const char *, const char *, const char *)");
  }
  iVar2 = qpdf_has_error(qpdf);
  if (iVar2 == 0) {
    __assert_fail("qpdf_has_error(qpdf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x42b,"void test35(const char *, const char *, const char *, const char *)");
  }
  uVar4 = qpdf_get_error(qpdf);
  iVar2 = qpdf_get_error_code(qpdf,uVar4);
  if (iVar2 == 0) {
    __assert_fail("qpdf_get_error_code(qpdf, e) != QPDF_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x42d,"void test35(const char *, const char *, const char *, const char *)");
  }
  iVar2 = qpdf_has_error(qpdf);
  if (iVar2 != 0) {
    __assert_fail("!qpdf_has_error(qpdf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x42e,"void test35(const char *, const char *, const char *, const char *)");
  }
  iVar2 = qpdf_find_page_by_id(qpdf,100,0);
  if (iVar2 != -1) {
    __assert_fail("qpdf_find_page_by_id(qpdf, 100, 0) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x430,"void test35(const char *, const char *, const char *, const char *)");
  }
  iVar2 = qpdf_has_error(qpdf);
  if (iVar2 == 0) {
    __assert_fail("qpdf_has_error(qpdf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x431,"void test35(const char *, const char *, const char *, const char *)");
  }
  uVar4 = qpdf_get_error(qpdf);
  iVar2 = qpdf_get_error_code(qpdf,uVar4);
  if (iVar2 == 0) {
    __assert_fail("qpdf_get_error_code(qpdf, e) != QPDF_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x433,"void test35(const char *, const char *, const char *, const char *)");
  }
  iVar2 = qpdf_has_error(qpdf);
  p_Var1 = qpdf;
  if (iVar2 != 0) {
    __assert_fail("!qpdf_has_error(qpdf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x434,"void test35(const char *, const char *, const char *, const char *)");
  }
  uVar3 = qpdf_get_root(qpdf);
  iVar2 = qpdf_find_page_by_oh(p_Var1,uVar3);
  if (iVar2 != -1) {
    __assert_fail("qpdf_find_page_by_oh(qpdf, qpdf_get_root(qpdf)) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x436,"void test35(const char *, const char *, const char *, const char *)");
  }
  iVar2 = qpdf_more_warnings(qpdf);
  if (iVar2 == 0) {
    __assert_fail("qpdf_more_warnings(qpdf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x437,"void test35(const char *, const char *, const char *, const char *)");
  }
  uVar4 = qpdf_next_warning(qpdf);
  iVar2 = qpdf_get_error_code(qpdf,uVar4);
  if (iVar2 != 0) {
    iVar2 = qpdf_has_error(qpdf);
    if (iVar2 == 0) {
      __assert_fail("qpdf_has_error(qpdf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x43a,"void test35(const char *, const char *, const char *, const char *)");
    }
    uVar4 = qpdf_get_error(qpdf);
    iVar2 = qpdf_get_error_code(qpdf,uVar4);
    if (iVar2 == 0) {
      __assert_fail("qpdf_get_error_code(qpdf, e) != QPDF_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x43c,"void test35(const char *, const char *, const char *, const char *)");
    }
    iVar2 = qpdf_has_error(qpdf);
    if (iVar2 != 0) {
      __assert_fail("!qpdf_has_error(qpdf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x43d,"void test35(const char *, const char *, const char *, const char *)");
    }
    iVar2 = qpdf_find_page_by_id(qpdf,100,0);
    if (iVar2 != -1) {
      __assert_fail("qpdf_find_page_by_id(qpdf, 100, 0) == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x43f,"void test35(const char *, const char *, const char *, const char *)");
    }
    iVar2 = qpdf_has_error(qpdf);
    if (iVar2 == 0) {
      __assert_fail("qpdf_has_error(qpdf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x440,"void test35(const char *, const char *, const char *, const char *)");
    }
    uVar4 = qpdf_get_error(qpdf);
    iVar2 = qpdf_get_error_code(qpdf,uVar4);
    if (iVar2 == 0) {
      __assert_fail("qpdf_get_error_code(qpdf, e) != QPDF_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x442,"void test35(const char *, const char *, const char *, const char *)");
    }
    iVar2 = qpdf_has_error(qpdf);
    if (iVar2 != 0) {
      __assert_fail("!qpdf_has_error(qpdf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x443,"void test35(const char *, const char *, const char *, const char *)");
    }
    iVar2 = qpdf_add_page(qpdf,qpdf,1000,0);
    if (iVar2 != 0) {
      report_errors();
      return;
    }
    __assert_fail("qpdf_add_page(qpdf, qpdf, 1000, QPDF_FALSE) != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x445,"void test35(const char *, const char *, const char *, const char *)");
  }
  __assert_fail("qpdf_get_error_code(qpdf, e) != QPDF_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                0x439,"void test35(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test35(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* This test uses 11-pages.pdf */

    assert(qpdf_get_num_pages(qpdf) == -1);
    assert(qpdf_has_error(qpdf));
    qpdf_error e = qpdf_get_error(qpdf);
    assert(qpdf_get_error_code(qpdf, e) != QPDF_SUCCESS);
    assert(!qpdf_has_error(qpdf));

    assert(qpdf_read(qpdf, infile, password) == 0);

    qpdf_oh range = qpdf_get_page_n(qpdf, 11);
    assert(!qpdf_oh_is_initialized(qpdf, range));
    assert(qpdf_has_error(qpdf));
    e = qpdf_get_error(qpdf);
    assert(qpdf_get_error_code(qpdf, e) != QPDF_SUCCESS);
    assert(!qpdf_has_error(qpdf));

    assert(qpdf_find_page_by_id(qpdf, 100, 0) == -1);
    assert(qpdf_has_error(qpdf));
    e = qpdf_get_error(qpdf);
    assert(qpdf_get_error_code(qpdf, e) != QPDF_SUCCESS);
    assert(!qpdf_has_error(qpdf));

    assert(qpdf_find_page_by_oh(qpdf, qpdf_get_root(qpdf)) == -1);
    assert(qpdf_more_warnings(qpdf));
    e = qpdf_next_warning(qpdf);
    assert(qpdf_get_error_code(qpdf, e) != QPDF_SUCCESS);
    assert(qpdf_has_error(qpdf));
    e = qpdf_get_error(qpdf);
    assert(qpdf_get_error_code(qpdf, e) != QPDF_SUCCESS);
    assert(!qpdf_has_error(qpdf));

    assert(qpdf_find_page_by_id(qpdf, 100, 0) == -1);
    assert(qpdf_has_error(qpdf));
    e = qpdf_get_error(qpdf);
    assert(qpdf_get_error_code(qpdf, e) != QPDF_SUCCESS);
    assert(!qpdf_has_error(qpdf));

    assert(qpdf_add_page(qpdf, qpdf, 1000, QPDF_FALSE) != 0);

    report_errors();
}